

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O1

int point_mul_id_tc26_gost_3410_2012_512_paramSetA
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *puVar1;
  uint64_t *out1;
  char cVar2;
  int iVar3;
  int iVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  pt_prj_t_conflict2 *ppVar7;
  int iVar8;
  byte bVar9;
  uint64_t *puVar10;
  pt_prj_t_conflict2 *ppVar11;
  uint64_t *puVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  pt_prj_t_conflict2 Q;
  int8_t rnaf [103];
  pt_prj_t_conflict2 precomp [16];
  uint8_t local_12e8 [64];
  uint8_t local_12a8 [64];
  pt_aff_t_conflict2 local_1268;
  byte local_11c8 [64];
  pt_prj_t_conflict2 local_1188;
  pt_prj_t_conflict2 local_1098;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [16];
  undefined1 local_f68 [16];
  undefined1 local_f58 [15];
  undefined1 uStack_f49;
  undefined6 uStack_f48;
  char cStack_f42;
  pt_prj_t_conflict2 local_f38 [16];
  
  bVar9 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar8 = 0;
  if ((((pBVar6 != (BIGNUM *)0x0) &&
       (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar5,pBVar6,ctx), iVar8 = iVar4,
       iVar3 != 0)) && (iVar4 = BN_bn2lebinpad(pBVar5,local_12a8,0x40), iVar4 == 0x40)) &&
     ((iVar4 = BN_bn2lebinpad(pBVar6,local_12e8,0x40), iVar4 == 0x40 &&
      (iVar4 = BN_bn2lebinpad(m,local_11c8,0x40), iVar4 == 0x40)))) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_from_bytes(local_1268.X,local_12a8);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_from_bytes(local_1268.Y,local_12e8);
    local_f58 = SUB1615((undefined1  [16])0x0,0);
    local_f68 = (undefined1  [16])0x0;
    local_f78 = (undefined1  [16])0x0;
    local_f88 = (undefined1  [16])0x0;
    local_f98 = (undefined1  [16])0x0;
    local_fa8 = (undefined1  [16])0x0;
    uStack_f49 = 0;
    uStack_f48 = 0;
    cStack_f42 = '\0';
    lVar14 = 0;
    memset(&local_1098,0,0xf0);
    memset(&local_1188,0,0xf0);
    ppVar7 = local_f38;
    precomp_wnaf(ppVar7,&local_1268);
    scalar_rwnaf(local_fa8,local_11c8);
    iVar8 = (int)cStack_f42;
    do {
      bVar15 = (int)(iVar8 + -1 >> 1 ^ (uint)lVar14) < 1;
      fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                (local_1098.X,bVar15,local_1098.X,ppVar7->X);
      fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                (local_1098.Y,bVar15,local_1098.Y,ppVar7->Y);
      fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                (local_1098.Z,bVar15,local_1098.Z,ppVar7->Z);
      lVar14 = lVar14 + 1;
      ppVar7 = ppVar7 + 1;
    } while (lVar14 != 0x10);
    puVar1 = local_1188.Y;
    lVar14 = 0x65;
    out1 = local_1188.Z;
    do {
      iVar8 = 5;
      do {
        point_double(&local_1098,&local_1098);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      cVar2 = local_fa8[lVar14];
      ppVar7 = local_f38;
      lVar13 = 0;
      do {
        bVar15 = (int)((int)(char)(-1 - (cVar2 >> 7)) + ((int)cVar2 >> 0x1f ^ (int)cVar2) >> 1 ^
                      (uint)lVar13) < 1;
        fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                  (local_1188.X,bVar15,local_1188.X,ppVar7->X);
        fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(puVar1,bVar15,puVar1,ppVar7->Y);
        fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(out1,bVar15,out1,ppVar7->Z);
        lVar13 = lVar13 + 1;
        ppVar7 = ppVar7 + 1;
      } while (lVar13 != 0x10);
      local_1268.Y[0] = 0x1ffffffffffb8e - local_1188.Y[0];
      local_1268.Y[1] = 0xffffffffffffe - local_1188.Y[1];
      local_1268.Y[2] = 0xffffffffffffe - local_1188.Y[2];
      local_1268.Y[3] = 0xffffffffffffe - local_1188.Y[3];
      local_1268.Y[4] = 0xffffffffffffe - local_1188.Y[4];
      local_1268.Y[5] = 0x1ffffffffffffe - local_1188.Y[5];
      local_1268.Y[6] = 0xffffffffffffe - local_1188.Y[6];
      local_1268.Y[7] = 0xffffffffffffe - local_1188.Y[7];
      local_1268.Y[8] = 0xffffffffffffe - local_1188.Y[8];
      local_1268.Y[9] = 0xffffffffffffe - local_1188.Y[9];
      fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                (puVar1,(byte)(cVar2 >> 7) >> 7,puVar1,local_1268.Y);
      point_add_proj(&local_1098,&local_1098,&local_1188);
      bVar15 = lVar14 != 0;
      lVar14 = lVar14 + -1;
    } while (bVar15);
    ppVar7 = local_f38;
    ppVar11 = &local_1188;
    for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
      ppVar11->X[0] = ppVar7->X[0];
      ppVar7 = (pt_prj_t_conflict2 *)((long)ppVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      ppVar11 = (pt_prj_t_conflict2 *)((long)ppVar11 + (ulong)bVar9 * -0x10 + 8);
    }
    local_1188.Y[0] = 0x1ffffffffffb8e - local_f38[0].Y[0];
    local_1188.Y[1] = 0xffffffffffffe - local_f38[0].Y[1];
    local_1188.Y[2] = 0xffffffffffffe - local_f38[0].Y[2];
    local_1188.Y[3] = 0xffffffffffffe - local_f38[0].Y[3];
    local_1188.Y[4] = 0xffffffffffffe - local_f38[0].Y[4];
    local_1188.Y[5] = 0x1ffffffffffffe - local_f38[0].Y[5];
    local_1188.Y[6] = 0xffffffffffffe - local_f38[0].Y[6];
    local_1188.Y[7] = 0xffffffffffffe - local_f38[0].Y[7];
    local_1188.Y[8] = 0xffffffffffffe - local_f38[0].Y[8];
    local_1188.Y[9] = 0xffffffffffffe - local_f38[0].Y[9];
    puVar10 = local_f38[0].Z;
    puVar12 = out1;
    for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar12 = *puVar10;
      puVar10 = puVar10 + (ulong)bVar9 * -2 + 1;
      puVar12 = puVar12 + (ulong)bVar9 * -2 + 1;
    }
    point_add_proj(&local_1188,&local_1188,&local_1098);
    bVar9 = local_11c8[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
              (local_1098.X,bVar9,local_1188.X,local_1098.X);
    puVar10 = local_1098.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(puVar10,bVar9,puVar1,puVar10);
    puVar1 = local_1098.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(puVar1,bVar9,out1,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(puVar1,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_1268.X,local_1098.X,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_1268.Y,puVar10,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(local_12a8,local_1268.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(local_12e8,local_1268.Y);
    iVar8 = CRYPTO_memcmp("",local_12a8,0x40);
    if ((iVar8 == 0) && (iVar8 = CRYPTO_memcmp("",local_12e8,0x40), iVar8 == 0)) {
      iVar8 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar8 == 0) {
        iVar8 = 0;
        goto LAB_00133dd6;
      }
    }
    else {
      lVar14 = BN_lebin2bn(local_12a8,0x40,pBVar5);
      iVar8 = 0;
      if ((lVar14 == 0) ||
         ((lVar14 = BN_lebin2bn(local_12e8,0x40,pBVar6), lVar14 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar5,pBVar6,ctx), iVar8 = 0, iVar4 == 0
          )))) goto LAB_00133dd6;
    }
    iVar8 = 1;
  }
LAB_00133dd6:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar8;
}

Assistant:

int
    point_mul_id_tc26_gost_3410_2012_512_paramSetA(const EC_GROUP *group,
                                                   EC_POINT *r,
                                                   const EC_POINT *q,
                                                   const BIGNUM *m,
                                                   BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}